

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_store_fpr32h(DisasContext_conflict6 *ctx,TCGv_i32 t,int reg)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 ret;
  uintptr_t o;
  
  if ((ctx->hflags & 0x40) == 0) {
    gen_store_fpr32(ctx,t,reg | 1);
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_extu_i32_i64_mips64el(tcg_ctx,ret,t);
  tcg_gen_deposit_i64_mips64el
            (tcg_ctx,tcg_ctx->fpu_f64[(uint)reg],tcg_ctx->fpu_f64[(uint)reg],ret,0x20,0x20);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_store_fpr32h(DisasContext *ctx, TCGv_i32 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_F64) {
        TCGv_i64 t64 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64(tcg_ctx, t64, t);
        tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->fpu_f64[reg], tcg_ctx->fpu_f64[reg], t64, 32, 32);
        tcg_temp_free_i64(tcg_ctx, t64);
    } else {
        gen_store_fpr32(ctx, t, reg | 1);
    }
}